

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall ON_3dmUnitsAndTolerances::IsValid(ON_3dmUnitsAndTolerances *this)

{
  bool bVar1;
  ON_3dmUnitsAndTolerances *this_local;
  
  if ((((this->m_distance_display_precision < 0) || (8 < this->m_distance_display_precision)) ||
      ((FeetInches|Fractional) < this->m_distance_display_mode)) ||
     (bVar1 = TolerancesAreValid(this), !bVar1)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_3dmUnitsAndTolerances::IsValid() const
{
  for (;;)
  {
    // April 17, 2023 - Tim
    // Changed upper limit to 8 so we can use the display precision
    // stuff found in the annotation code for V8
    // Fixes https://mcneel.myjetbrains.com/youtrack/issue/RH-74242
    if (!(m_distance_display_precision >= 0 && m_distance_display_precision <= 8))
      break;

    if (!((int)m_distance_display_mode >= 0 && (int)m_distance_display_mode <= 3))
      break;

    if (!TolerancesAreValid())
      break;

    return true;
  }
  return false;
}